

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.cpp
# Opt level: O2

void __thiscall
boost::deflate::deflate_stream_test::doMatrix
          (deflate_stream_test *this,ICompressor *c,string *check,pmf_t pmf)

{
  int iVar1;
  code *pcVar2;
  int level;
  int iVar3;
  long in_R8;
  int strategy;
  int iVar4;
  int memLevel;
  int iVar5;
  long *plVar6;
  
  plVar6 = (long *)((long)&(this->zlib_compressor).super_ICompressor._vptr_ICompressor + in_R8);
  iVar3 = 0;
LAB_001080a5:
  if (iVar3 == 10) {
    if ((pmf & 1) != 0) {
      pmf = *(undefined8 *)(*plVar6 + -1 + pmf);
    }
    (*(code *)pmf)(plVar6,c,0xffffffffffffffff,0xf,8,0,check);
    return;
  }
  iVar1 = 8;
  do {
    if (iVar1 != 8) {
      if (iVar1 == 10) break;
      for (iVar4 = 0; iVar4 != 5; iVar4 = iVar4 + 1) {
        for (iVar5 = 8; iVar5 != 10; iVar5 = iVar5 + 1) {
          pcVar2 = (code *)pmf;
          if ((pmf & 1) != 0) {
            pcVar2 = *(code **)(*plVar6 + -1 + pmf);
          }
          (*pcVar2)(plVar6,c,iVar3,9,iVar5,iVar4,check);
        }
      }
    }
    iVar1 = iVar1 + 1;
  } while( true );
  iVar3 = iVar3 + 1;
  goto LAB_001080a5;
}

Assistant:

void doMatrix(ICompressor& c, std::string const& check, pmf_t pmf)
    {
        for(int level = 0; level <= 9; ++level)
        {
            for(int windowBits = 8; windowBits <= 9; ++windowBits)
            {
                // zlib has a bug with windowBits==8
                if(windowBits == 8)
                    continue;
                for(int strategy = 0; strategy <= 4; ++strategy)
                {
                    for (int memLevel = 8; memLevel <= 9; ++memLevel)
                    {
                        (this->*pmf)(
                            c, level, windowBits, memLevel, strategy, check);
                    }
                }
            }
        }

        // Check default settings
        (this->*pmf)(c, compression::default_size, 15, 8, 0, check);
    }